

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_args.cc
# Opt level: O2

input_options * parse_source(input_options *__return_storage_ptr__,vw *all,options_i *options)

{
  string *location;
  input_options *piVar1;
  bool *pbVar2;
  bool bVar3;
  int iVar4;
  option_group_definition *poVar5;
  options_boost_po *this;
  vw_exception *this_00;
  ostream *poVar6;
  allocator local_1727;
  allocator local_1726;
  allocator local_1725;
  allocator local_1724;
  allocator local_1723;
  allocator local_1722;
  allocator local_1721;
  allocator local_1720;
  allocator local_171f;
  allocator local_171e;
  allocator local_171d;
  allocator local_171c;
  allocator local_171b;
  allocator local_171a;
  allocator local_1719;
  allocator local_1718;
  allocator local_1717;
  allocator local_1716;
  allocator local_1715;
  allocator local_1714;
  allocator local_1713;
  allocator local_1712;
  allocator local_1711;
  allocator local_1710;
  allocator local_170f;
  allocator local_170e;
  allocator local_170d;
  allocator local_170c;
  allocator local_170b;
  allocator local_170a;
  allocator local_1709;
  input_options *local_1708;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *local_1700;
  bool *local_16f8;
  string local_16f0 [32];
  string local_16d0;
  string local_16b0 [32];
  string local_1690;
  string local_1670 [32];
  string local_1650 [32];
  string local_1630;
  string local_1610 [32];
  string local_15f0;
  string local_15d0 [32];
  string local_15b0;
  string local_1590 [32];
  string local_1570;
  string local_1550 [32];
  string local_1530 [32];
  string local_1510;
  string local_14f0 [32];
  string local_14d0;
  string local_14b0 [32];
  string local_1490;
  string local_1470 [32];
  string local_1450;
  string local_1430 [32];
  string local_1410;
  string local_13f0 [32];
  string local_13d0;
  string local_13b0 [32];
  string local_1390;
  string local_1370 [32];
  string local_1350 [32];
  string local_1330;
  string local_1310;
  undefined1 local_12f0 [160];
  string data;
  string local_1220 [32];
  string local_1200 [312];
  string local_10c8;
  option_group_definition input_options;
  undefined1 local_1070 [160];
  undefined1 local_fd0 [160];
  undefined1 local_f30 [80];
  string local_ee0 [80];
  undefined1 local_e90 [80];
  string local_e40 [80];
  undefined1 local_df0 [160];
  undefined1 local_d50 [160];
  undefined1 local_cb0 [160];
  undefined1 local_c10 [160];
  undefined1 local_b70 [160];
  undefined1 local_ad0 [160];
  undefined1 local_a30 [160];
  undefined1 local_990 [160];
  typed_option<bool> local_8f0;
  typed_option<bool> local_850;
  typed_option<bool> local_7b0;
  typed_option<bool> local_710;
  typed_option<bool> local_670;
  typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_5d0;
  typed_option<bool> local_530;
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_490;
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_3f0;
  typed_option<unsigned_long> local_350;
  typed_option<unsigned_long> local_2b0;
  typed_option<bool> local_210;
  typed_option<bool> local_170;
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_d0;
  
  (__return_storage_ptr__->pid_file)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->pid_file).field_2;
  (__return_storage_ptr__->pid_file)._M_string_length = 0;
  (__return_storage_ptr__->pid_file).field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->port_file)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->port_file).field_2;
  (__return_storage_ptr__->port_file)._M_string_length = 0;
  (__return_storage_ptr__->port_file).field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->cache_files).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->cache_files).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->cache_files).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1708 = __return_storage_ptr__;
  std::__cxx11::string::string((string *)&local_1310,"Input options",(allocator *)&data);
  VW::config::option_group_definition::option_group_definition(&input_options,&local_1310);
  std::__cxx11::string::~string((string *)&local_1310);
  std::__cxx11::string::string((string *)&local_1330,"data",&local_1709);
  location = &all->data_filename;
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&data,&local_1330,location);
  std::__cxx11::string::string(local_1350,"d",&local_170a);
  std::__cxx11::string::_M_assign(local_1200);
  std::__cxx11::string::string(local_1370,"Example set",&local_170b);
  std::__cxx11::string::_M_assign(local_1220);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option(&local_d0,
               (typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&data);
  poVar5 = VW::config::option_group_definition::add<std::__cxx11::string>(&input_options,&local_d0);
  std::__cxx11::string::string((string *)&local_1390,"daemon",&local_170c);
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_12f0,&local_1390,&__return_storage_ptr__->daemon);
  std::__cxx11::string::string(local_13b0,"persistent daemon mode on port 26542",&local_170d);
  std::__cxx11::string::_M_assign((string *)(local_12f0 + 0x30));
  VW::config::typed_option<bool>::typed_option(&local_170,(typed_option<bool> *)local_12f0);
  poVar5 = VW::config::option_group_definition::add<bool>(poVar5,&local_170);
  std::__cxx11::string::string((string *)&local_13d0,"foreground",&local_170e);
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_1070,&local_13d0,&__return_storage_ptr__->foreground);
  std::__cxx11::string::string
            (local_13f0,"in persistent daemon mode, do not run in the background",&local_170f);
  std::__cxx11::string::_M_assign((string *)(local_1070 + 0x30));
  VW::config::typed_option<bool>::typed_option(&local_210,(typed_option<bool> *)local_1070);
  poVar5 = VW::config::option_group_definition::add<bool>(poVar5,&local_210);
  std::__cxx11::string::string((string *)&local_1410,"port",&local_1710);
  VW::config::typed_option<unsigned_long>::typed_option
            ((typed_option<unsigned_long> *)local_fd0,&local_1410,&__return_storage_ptr__->port);
  std::__cxx11::string::string
            (local_1430,"port to listen on; use 0 to pick unused port",&local_1711);
  std::__cxx11::string::_M_assign((string *)(local_fd0 + 0x30));
  VW::config::typed_option<unsigned_long>::typed_option
            (&local_2b0,(typed_option<unsigned_long> *)local_fd0);
  poVar5 = VW::config::option_group_definition::add<unsigned_long>(poVar5,&local_2b0);
  std::__cxx11::string::string((string *)&local_1450,"num_children",&local_1712);
  VW::config::typed_option<unsigned_long>::typed_option
            ((typed_option<unsigned_long> *)local_d50,&local_1450,&all->num_children);
  std::__cxx11::string::string
            (local_1470,"number of children for persistent daemon mode",&local_1713);
  std::__cxx11::string::_M_assign((string *)(local_d50 + 0x30));
  VW::config::typed_option<unsigned_long>::typed_option
            (&local_350,(typed_option<unsigned_long> *)local_d50);
  poVar5 = VW::config::option_group_definition::add<unsigned_long>(poVar5,&local_350);
  std::__cxx11::string::string((string *)&local_1490,"pid_file",&local_1714);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_df0,&local_1490,&__return_storage_ptr__->pid_file);
  std::__cxx11::string::string(local_14b0,"Write pid file in persistent daemon mode",&local_1715);
  std::__cxx11::string::_M_assign((string *)(local_df0 + 0x30));
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option(&local_3f0,
               (typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_df0);
  poVar5 = VW::config::option_group_definition::add<std::__cxx11::string>(poVar5,&local_3f0);
  std::__cxx11::string::string((string *)&local_14d0,"port_file",&local_1716);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_990,&local_14d0,&__return_storage_ptr__->port_file);
  std::__cxx11::string::string(local_14f0,"Write port used in persistent daemon mode",&local_1717);
  std::__cxx11::string::_M_assign((string *)(local_990 + 0x30));
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option(&local_490,
               (typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_990);
  poVar5 = VW::config::option_group_definition::add<std::__cxx11::string>(poVar5,&local_490);
  std::__cxx11::string::string((string *)&local_1510,"cache",&local_1718);
  local_16f8 = &__return_storage_ptr__->cache;
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_e90,&local_1510,local_16f8);
  std::__cxx11::string::string(local_1530,"c",&local_1719);
  std::__cxx11::string::_M_assign(local_e40);
  std::__cxx11::string::string(local_1550,"Use a cache.  The default is <data>.cache",&local_171a);
  std::__cxx11::string::_M_assign((string *)(local_e90 + 0x30));
  VW::config::typed_option<bool>::typed_option(&local_530,(typed_option<bool> *)local_e90);
  poVar5 = VW::config::option_group_definition::add<bool>(poVar5,&local_530);
  std::__cxx11::string::string((string *)&local_1570,"cache_file",&local_171b);
  local_1700 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               &__return_storage_ptr__->cache_files;
  VW::config::
  typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::typed_option((typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)local_a30,&local_1570,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_1700);
  std::__cxx11::string::string(local_1590,"The location(s) of cache_file.",&local_171c);
  std::__cxx11::string::_M_assign((string *)(local_a30 + 0x30));
  VW::config::
  typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::typed_option(&local_5d0,
                 (typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)local_a30);
  poVar5 = VW::config::option_group_definition::
           add<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                     (poVar5,&local_5d0);
  std::__cxx11::string::string((string *)&local_15b0,"json",&local_171d);
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_ad0,&local_15b0,&__return_storage_ptr__->json);
  std::__cxx11::string::string(local_15d0,"Enable JSON parsing.",&local_171e);
  std::__cxx11::string::_M_assign((string *)(local_ad0 + 0x30));
  VW::config::typed_option<bool>::typed_option(&local_670,(typed_option<bool> *)local_ad0);
  poVar5 = VW::config::option_group_definition::add<bool>(poVar5,&local_670);
  std::__cxx11::string::string((string *)&local_15f0,"dsjson",&local_171f);
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_b70,&local_15f0,&__return_storage_ptr__->dsjson);
  std::__cxx11::string::string(local_1610,"Enable Decision Service JSON parsing.",&local_1720);
  std::__cxx11::string::_M_assign((string *)(local_b70 + 0x30));
  VW::config::typed_option<bool>::typed_option(&local_710,(typed_option<bool> *)local_b70);
  poVar5 = VW::config::option_group_definition::add<bool>(poVar5,&local_710);
  std::__cxx11::string::string((string *)&local_1630,"kill_cache",&local_1721);
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_f30,&local_1630,&__return_storage_ptr__->kill_cache);
  std::__cxx11::string::string(local_1650,"k",&local_1722);
  std::__cxx11::string::_M_assign(local_ee0);
  std::__cxx11::string::string
            (local_1670,"do not reuse existing cache: create a new one always",&local_1723);
  std::__cxx11::string::_M_assign((string *)(local_f30 + 0x30));
  VW::config::typed_option<bool>::typed_option(&local_7b0,(typed_option<bool> *)local_f30);
  poVar5 = VW::config::option_group_definition::add<bool>(poVar5,&local_7b0);
  std::__cxx11::string::string((string *)&local_1690,"compressed",&local_1724);
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_c10,&local_1690,&__return_storage_ptr__->compressed);
  std::__cxx11::string::string
            (local_16b0,
             "use gzip format whenever possible. If a cache file is being created, this option creates a compressed cache file. A mixture of raw-text & compressed inputs are supported with autodetection."
             ,&local_1725);
  std::__cxx11::string::_M_assign((string *)(local_c10 + 0x30));
  VW::config::typed_option<bool>::typed_option(&local_850,(typed_option<bool> *)local_c10);
  poVar5 = VW::config::option_group_definition::add<bool>(poVar5,&local_850);
  std::__cxx11::string::string((string *)&local_16d0,"no_stdin",&local_1726);
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_cb0,&local_16d0,&all->stdin_off);
  std::__cxx11::string::string(local_16f0,"do not default to reading from stdin",&local_1727);
  std::__cxx11::string::_M_assign((string *)(local_cb0 + 0x30));
  VW::config::typed_option<bool>::typed_option(&local_8f0,(typed_option<bool> *)local_cb0);
  VW::config::option_group_definition::add<bool>(poVar5,&local_8f0);
  VW::config::typed_option<bool>::~typed_option(&local_8f0);
  std::__cxx11::string::~string(local_16f0);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)local_cb0);
  std::__cxx11::string::~string((string *)&local_16d0);
  VW::config::typed_option<bool>::~typed_option(&local_850);
  std::__cxx11::string::~string(local_16b0);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)local_c10);
  std::__cxx11::string::~string((string *)&local_1690);
  VW::config::typed_option<bool>::~typed_option(&local_7b0);
  std::__cxx11::string::~string(local_1670);
  std::__cxx11::string::~string(local_1650);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)local_f30);
  std::__cxx11::string::~string((string *)&local_1630);
  VW::config::typed_option<bool>::~typed_option(&local_710);
  std::__cxx11::string::~string(local_1610);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)local_b70);
  std::__cxx11::string::~string((string *)&local_15f0);
  VW::config::typed_option<bool>::~typed_option(&local_670);
  std::__cxx11::string::~string(local_15d0);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)local_ad0);
  std::__cxx11::string::~string((string *)&local_15b0);
  VW::config::
  typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~typed_option(&local_5d0);
  std::__cxx11::string::~string(local_1590);
  VW::config::
  typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~typed_option((typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)local_a30);
  std::__cxx11::string::~string((string *)&local_1570);
  VW::config::typed_option<bool>::~typed_option(&local_530);
  std::__cxx11::string::~string(local_1550);
  std::__cxx11::string::~string(local_1530);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)local_e90);
  std::__cxx11::string::~string((string *)&local_1510);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~typed_option(&local_490);
  std::__cxx11::string::~string(local_14f0);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)local_990);
  std::__cxx11::string::~string((string *)&local_14d0);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~typed_option(&local_3f0);
  std::__cxx11::string::~string(local_14b0);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)local_df0);
  std::__cxx11::string::~string((string *)&local_1490);
  VW::config::typed_option<unsigned_long>::~typed_option(&local_350);
  std::__cxx11::string::~string(local_1470);
  VW::config::typed_option<unsigned_long>::~typed_option((typed_option<unsigned_long> *)local_d50);
  std::__cxx11::string::~string((string *)&local_1450);
  VW::config::typed_option<unsigned_long>::~typed_option(&local_2b0);
  std::__cxx11::string::~string(local_1430);
  VW::config::typed_option<unsigned_long>::~typed_option((typed_option<unsigned_long> *)local_fd0);
  std::__cxx11::string::~string((string *)&local_1410);
  VW::config::typed_option<bool>::~typed_option(&local_210);
  std::__cxx11::string::~string(local_13f0);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)local_1070);
  std::__cxx11::string::~string((string *)&local_13d0);
  VW::config::typed_option<bool>::~typed_option(&local_170);
  std::__cxx11::string::~string(local_13b0);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)local_12f0);
  std::__cxx11::string::~string((string *)&local_1390);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~typed_option(&local_d0);
  std::__cxx11::string::~string(local_1370);
  std::__cxx11::string::~string(local_1350);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&data);
  std::__cxx11::string::~string((string *)&local_1330);
  (**options->_vptr_options_i)(options,&input_options);
  this = (options_boost_po *)
         __dynamic_cast(options,&VW::config::options_i::typeinfo,
                        &VW::config::options_boost_po::typeinfo,0);
  if (this != (options_boost_po *)0x0) {
    data._M_dataplus._M_p = (pointer)&data.field_2;
    data._M_string_length = 0;
    data.field_2._M_local_buf[0] = '\0';
    std::__cxx11::string::string((string *)local_12f0,"data",(allocator *)local_1070);
    bVar3 = VW::config::options_boost_po::try_get_positional_option_token
                      (this,(string *)local_12f0,&data,-1);
    std::__cxx11::string::~string((string *)local_12f0);
    if (bVar3) {
      bVar3 = std::operator!=(location,&data);
      if (bVar3) {
        std::__cxx11::string::_M_assign((string *)location);
      }
    }
    std::__cxx11::string::~string((string *)&data);
  }
  if (local_1708->daemon == false) {
    std::__cxx11::string::string((string *)&data,"pid_file",(allocator *)local_1070);
    iVar4 = (*options->_vptr_options_i[1])(options,&data);
    if ((char)iVar4 != '\0') {
      std::__cxx11::string::~string((string *)&data);
      goto LAB_0011b35d;
    }
    std::__cxx11::string::string((string *)local_12f0,"port",(allocator *)local_fd0);
    iVar4 = (*options->_vptr_options_i[1])(options,local_12f0);
    bVar3 = all->active;
    std::__cxx11::string::~string((string *)local_12f0);
    std::__cxx11::string::~string((string *)&data);
    if (((char)iVar4 != '\0') && ((bVar3 & 1U) == 0)) goto LAB_0011b35d;
  }
  else {
LAB_0011b35d:
    all->daemon = true;
    all->numpasses = 100000;
  }
  pbVar2 = local_16f8;
  if (*local_16f8 == true) {
    std::operator+(&data,location,".cache");
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>(local_1700,&data);
    std::__cxx11::string::~string((string *)&data);
  }
  piVar1 = local_1708;
  if (__return_storage_ptr__->compressed == true) {
    set_compressed(all->p);
  }
  std::__cxx11::string::string((string *)&data,".gz",(allocator *)local_12f0);
  bVar3 = ends_with(location,&data);
  std::__cxx11::string::~string((string *)&data);
  if (bVar3) {
    set_compressed(all->p);
  }
  bVar3 = *pbVar2;
  if (bVar3 == false) {
    std::__cxx11::string::string((string *)local_12f0,"cache_file",(allocator *)local_fd0);
    iVar4 = (*options->_vptr_options_i[1])(options,local_12f0);
    if ((char)iVar4 != '\0') goto LAB_0011b44c;
    std::__cxx11::string::~string((string *)local_12f0);
  }
  else {
LAB_0011b44c:
    std::__cxx11::string::string((string *)&data,"invert_hash",(allocator *)local_1070);
    iVar4 = (*options->_vptr_options_i[1])(options,&data);
    std::__cxx11::string::~string((string *)&data);
    if (bVar3 == false) {
      std::__cxx11::string::~string((string *)local_12f0);
    }
    if ((char)iVar4 != '\0') {
      std::__cxx11::stringstream::stringstream((stringstream *)&data);
      std::operator<<((ostream *)&data.field_2,
                      "invert_hash is incompatible with a cache file.  Use it in single pass mode only."
                     );
      this_00 = (vw_exception *)__cxa_allocate_exception(0x38);
      std::__cxx11::stringbuf::str();
      VW::vw_exception::vw_exception
                (this_00,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/vowpalwabbit/parse_args.cc"
                 ,0x1d5,&local_10c8);
      __cxa_throw(this_00,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
    }
  }
  if (all->holdout_set_off == false) {
    std::__cxx11::string::string
              ((string *)&data,"output_feature_regularizer_binary",(allocator *)local_d50);
    iVar4 = (*options->_vptr_options_i[1])(options,&data);
    if ((char)iVar4 == '\0') {
      std::__cxx11::string::string
                ((string *)local_1070,"output_feature_regularizer_text",(allocator *)local_df0);
      iVar4 = (*options->_vptr_options_i[1])(options,local_1070);
      std::__cxx11::string::~string((string *)local_1070);
      std::__cxx11::string::~string((string *)&data);
      if ((char)iVar4 == '\0') goto LAB_0011b5ea;
    }
    else {
      std::__cxx11::string::~string((string *)&data);
    }
    all->holdout_set_off = true;
    poVar6 = std::operator<<(&(all->trace_message).super_ostream,
                             "Making holdout_set_off=true since output regularizer specified");
    std::endl<char,std::char_traits<char>>(poVar6);
  }
LAB_0011b5ea:
  VW::config::option_group_definition::~option_group_definition(&input_options);
  return piVar1;
}

Assistant:

input_options parse_source(vw& all, options_i& options)
{
  input_options parsed_options;

  option_group_definition input_options("Input options");
  input_options.add(make_option("data", all.data_filename).short_name("d").help("Example set"))
      .add(make_option("daemon", parsed_options.daemon).help("persistent daemon mode on port 26542"))
      .add(make_option("foreground", parsed_options.foreground)
               .help("in persistent daemon mode, do not run in the background"))
      .add(make_option("port", parsed_options.port).help("port to listen on; use 0 to pick unused port"))
      .add(make_option("num_children", all.num_children).help("number of children for persistent daemon mode"))
      .add(make_option("pid_file", parsed_options.pid_file).help("Write pid file in persistent daemon mode"))
      .add(make_option("port_file", parsed_options.port_file).help("Write port used in persistent daemon mode"))
      .add(make_option("cache", parsed_options.cache).short_name("c").help("Use a cache.  The default is <data>.cache"))
      .add(make_option("cache_file", parsed_options.cache_files).help("The location(s) of cache_file."))
      .add(make_option("json", parsed_options.json).help("Enable JSON parsing."))
      .add(make_option("dsjson", parsed_options.dsjson).help("Enable Decision Service JSON parsing."))
      .add(make_option("kill_cache", parsed_options.kill_cache)
               .short_name("k")
               .help("do not reuse existing cache: create a new one always"))
      .add(
          make_option("compressed", parsed_options.compressed)
              .help(
                  "use gzip format whenever possible. If a cache file is being created, this option creates a "
                  "compressed cache file. A mixture of raw-text & compressed inputs are supported with autodetection."))
      .add(make_option("no_stdin", all.stdin_off).help("do not default to reading from stdin"));

  options.add_and_parse(input_options);

  // If the option provider is program_options try and retrieve data as a positional parameter.
  options_i* options_ptr = &options;
  auto boost_options = dynamic_cast<options_boost_po*>(options_ptr);
  if (boost_options)
  {
    std::string data;
    if (boost_options->try_get_positional_option_token("data", data, -1))
    {
      if (all.data_filename != data)
      {
        all.data_filename = data;
      }
    }
  }

  if (parsed_options.daemon || options.was_supplied("pid_file") || (options.was_supplied("port") && !all.active))
  {
    all.daemon = true;
    // allow each child to process up to 1e5 connections
    all.numpasses = (size_t)1e5;
  }

  // Add an implicit cache file based on the data filename.
  if (parsed_options.cache)
  {
    parsed_options.cache_files.push_back(all.data_filename + ".cache");
  }

  if (parsed_options.compressed)
    set_compressed(all.p);

  if (ends_with(all.data_filename, ".gz"))
    set_compressed(all.p);

  if ((parsed_options.cache || options.was_supplied("cache_file")) && options.was_supplied("invert_hash"))
    THROW("invert_hash is incompatible with a cache file.  Use it in single pass mode only.");

  if (!all.holdout_set_off &&
      (options.was_supplied("output_feature_regularizer_binary") ||
          options.was_supplied("output_feature_regularizer_text")))
  {
    all.holdout_set_off = true;
    all.trace_message << "Making holdout_set_off=true since output regularizer specified" << endl;
  }

  return parsed_options;
}